

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneindex.cpp
# Opt level: O2

QList<QGraphicsItem_*> * __thiscall
QGraphicsSceneIndex::estimateTopLevelItems
          (QList<QGraphicsItem_*> *__return_storage_ptr__,QGraphicsSceneIndex *this,QRectF *rect,
          SortOrder order)

{
  uint uVar1;
  QGraphicsScenePrivate *this_00;
  QList<QGraphicsItem_*> *sorted;
  ulong uVar2;
  
  this_00 = *(QGraphicsScenePrivate **)(*(long *)(*(long *)(this + 8) + 0x78) + 8);
  QGraphicsScenePrivate::ensureSortedTopLevelItems(this_00);
  if (order == DescendingOrder) {
    (__return_storage_ptr__->d).size = 0;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QGraphicsItem **)0x0;
    uVar1 = (uint)(this_00->topLevelItems).d.size;
    QList<QGraphicsItem_*>::reserve(__return_storage_ptr__,(long)(int)uVar1);
    for (uVar2 = (ulong)uVar1; 0 < (int)uVar2; uVar2 = uVar2 - 1) {
      QList<QGraphicsItem_*>::append
                (__return_storage_ptr__,(this_00->topLevelItems).d.ptr[uVar2 - 1]);
    }
  }
  else {
    QArrayDataPointer<QGraphicsItem_*>::QArrayDataPointer
              (&__return_storage_ptr__->d,&(this_00->topLevelItems).d);
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QGraphicsItem *> QGraphicsSceneIndex::estimateTopLevelItems(const QRectF &rect, Qt::SortOrder order) const
{
    Q_D(const QGraphicsSceneIndex);
    Q_UNUSED(rect);
    QGraphicsScenePrivate *scened = d->scene->d_func();
    scened->ensureSortedTopLevelItems();
    if (order == Qt::DescendingOrder) {
        QList<QGraphicsItem *> sorted;
        const int numTopLevelItems = scened->topLevelItems.size();
        sorted.reserve(numTopLevelItems);
        for (int i = numTopLevelItems - 1; i >= 0; --i)
            sorted << scened->topLevelItems.at(i);
        return sorted;
    }
    return scened->topLevelItems;
}